

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O2

void __thiscall DTreePropagator::explain_cycle(DTreePropagator *this,int u,int v,vec<Lit> *pathe)

{
  BoolView *pBVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  Lit local_4c;
  vector<int,_std::allocator<int>_> pathn;
  
  RerootedUnionFind<Tint>::connectionsFromTo(&pathn,&this->ruf,u,v);
  uVar6 = 1;
  do {
    uVar4 = (ulong)(uVar6 - 1);
    if (((long)pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2) - 1U <= uVar4) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&pathn.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    uVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
              _vptr_Propagator[0x17])
                      (this,(ulong)(uint)pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start[uVar4],
                       (ulong)(uint)pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar6]);
    if (uVar3 == 0xffffffff) {
LAB_00164e9e:
      uVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x17])
                        (this,(ulong)(uint)pathn.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar6],
                         (ulong)(uint)pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar4]);
      uVar5 = (ulong)uVar3;
    }
    else {
      pBVar1 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data;
      uVar5 = (ulong)uVar3;
      if (sat.assigns.data[(uint)pBVar1[uVar5].v] == '\0') goto LAB_00164e9e;
      bVar2 = BoolView::isFalse(pBVar1 + uVar5);
      if (bVar2) goto LAB_00164e9e;
    }
    local_4c = BoolView::getValLit((this->super_DReachabilityPropagator).super_GraphPropagator.es.
                                   data + uVar5);
    vec<Lit>::push(pathe,&local_4c);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void DTreePropagator::explain_cycle(int u, int v, vec<Lit>& pathe) {
	assert(u != v);
	std::vector<int> pathn = ruf.connectionsFromTo(u, v);
	assert(!pathn.empty());
	for (unsigned int k = 0; k < pathn.size() - 1; k++) {
		int de = findEdge(pathn[k], pathn[k + 1]);
		if (de == -1 || !getEdgeVar(de).isFixed() || getEdgeVar(de).isFalse()) {
			de = findEdge(pathn[k + 1], pathn[k]);
		}
		assert(de != -1);
		assert(getEdgeVar(de).isFixed());
		assert(getEdgeVar(de).isTrue());
		pathe.push(getEdgeVar(de).getValLit());
	}
}